

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::Clear(FileOptions *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_21a;
  byte local_219;
  LogMessage local_218;
  LogFinisher local_1da;
  byte local_1d9;
  LogMessage local_1d8;
  LogFinisher local_19a;
  byte local_199;
  LogMessage local_198;
  LogFinisher local_15a;
  byte local_159;
  LogMessage local_158;
  LogFinisher local_11a;
  byte local_119;
  LogMessage local_118;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9d [20];
  byte local_89;
  LogMessage local_88;
  FileOptions *local_50;
  FileOptions *this_local;
  InternalMetadataWithArena *local_40;
  InternalMetadataWithArena *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_50 = this;
  internal::ExtensionSet::Clear(&this->_extensions_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear(&this->uninterpreted_option_);
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 0x7f) != 0) {
    bVar1 = has_java_package(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->java_package_,psVar2);
      local_89 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b1);
        local_89 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !java_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_9d,pLVar3);
      }
      if ((local_89 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_88);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->java_package_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_java_outer_classname(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->java_outer_classname_,psVar2);
      local_d9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b5);
        local_d9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_d8,
                            "CHECK failed: !java_outer_classname_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_da,pLVar3);
      }
      if ((local_d9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_d8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->java_outer_classname_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_go_package(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->go_package_,psVar2);
      local_119 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_118,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b9);
        local_119 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_118,
                            "CHECK failed: !go_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_11a,pLVar3);
      }
      if ((local_119 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_118);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->go_package_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_objc_class_prefix(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->objc_class_prefix_,psVar2);
      local_159 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_158,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20bd);
        local_159 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_158,
                            "CHECK failed: !objc_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_15a,pLVar3);
      }
      if ((local_159 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_158);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->objc_class_prefix_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_csharp_namespace(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->csharp_namespace_,psVar2);
      local_199 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_198,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20c1);
        local_199 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_198,
                            "CHECK failed: !csharp_namespace_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_19a,pLVar3);
      }
      if ((local_199 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_198);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->csharp_namespace_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_swift_prefix(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->swift_prefix_,psVar2);
      local_1d9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_1d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20c5);
        local_1d9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_1d8,
                            "CHECK failed: !swift_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_1da,pLVar3);
      }
      if ((local_1d9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_1d8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->swift_prefix_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_php_class_prefix(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->php_class_prefix_,psVar2);
      local_219 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_218,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20c9);
        local_219 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_218,
                            "CHECK failed: !php_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_21a,pLVar3);
      }
      if ((local_219 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_218);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->php_class_prefix_);
      std::__cxx11::string::clear();
    }
  }
  this->java_multiple_files_ = false;
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xff00) != 0) {
    memset(&this->java_generate_equals_and_hash_,0,7);
    this->optimize_for_ = 1;
  }
  this_local = (FileOptions *)&this->_has_bits_;
  memset(this_local,0,4);
  local_40 = &this->_internal_metadata_;
  if (((uint)(local_40->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_38 = local_40;
    local_10 = local_40;
    internal::InternalMetadataWithArena::DoClear(local_40);
  }
  return;
}

Assistant:

void FileOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileOptions)
  _extensions_.Clear();
  uninterpreted_option_.Clear();
  if (_has_bits_[0 / 32] & 127u) {
    if (has_java_package()) {
      GOOGLE_DCHECK(!java_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*java_package_.UnsafeRawStringPointer())->clear();
    }
    if (has_java_outer_classname()) {
      GOOGLE_DCHECK(!java_outer_classname_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*java_outer_classname_.UnsafeRawStringPointer())->clear();
    }
    if (has_go_package()) {
      GOOGLE_DCHECK(!go_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*go_package_.UnsafeRawStringPointer())->clear();
    }
    if (has_objc_class_prefix()) {
      GOOGLE_DCHECK(!objc_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*objc_class_prefix_.UnsafeRawStringPointer())->clear();
    }
    if (has_csharp_namespace()) {
      GOOGLE_DCHECK(!csharp_namespace_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*csharp_namespace_.UnsafeRawStringPointer())->clear();
    }
    if (has_swift_prefix()) {
      GOOGLE_DCHECK(!swift_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*swift_prefix_.UnsafeRawStringPointer())->clear();
    }
    if (has_php_class_prefix()) {
      GOOGLE_DCHECK(!php_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*php_class_prefix_.UnsafeRawStringPointer())->clear();
    }
  }
  java_multiple_files_ = false;
  if (_has_bits_[8 / 32] & 65280u) {
    ::memset(&java_generate_equals_and_hash_, 0, reinterpret_cast<char*>(&cc_enable_arenas_) -
      reinterpret_cast<char*>(&java_generate_equals_and_hash_) + sizeof(cc_enable_arenas_));
    optimize_for_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}